

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
          (QRotationGate1<std::complex<float>_> *this,int qubit,real_type cos,real_type sin,
          bool fixed)

{
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,qubit);
  (this->super_QGate1<std::complex<float>_>).field_0xc = fixed;
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00131f00;
  (this->rotation_).angle_.cos_ = cos;
  (this->rotation_).angle_.sin_ = sin;
  return;
}

Assistant:

QRotationGate1( const int qubit , const real_type cos ,
                        const real_type sin , const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( cos , sin )
        , QAdjustable( fixed )
        { }